

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<true> * __thiscall
LabelSinglePropertyState<true>::Uint(LabelSinglePropertyState<true> *this,Context<true> *ctx,uint v)

{
  BaseState<true> *pBVar1;
  undefined4 in_EDX;
  long in_RSI;
  Context<true> *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined8 local_8;
  
  *(long *)(in_RSI + 0x10) = *(long *)(in_RSI + 0x10) + 7;
  *(int *)(in_RSI + 0x18) = *(int *)(in_RSI + 0x18) + -7;
  pBVar1 = LabelObjectState<true>::Uint
                     ((LabelObjectState<true> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8,0);
  if (pBVar1 == (BaseState<true> *)0x0) {
    local_8 = (BaseState<true> *)0x0;
  }
  else {
    local_8 = *(BaseState<true> **)(in_RSI + 0x28);
  }
  return local_8;
}

Assistant:

BaseState<audit>* Uint(Context<audit>& ctx, unsigned v)
  {
    // skip "_label_"
    ctx.key += 7;
    ctx.key_length -= 7;

    if (ctx.label_object_state.Uint(ctx, v) == nullptr)
      return nullptr;

    return ctx.previous_state;
  }